

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_type *ttype,bool is_optional,
          bool is_forced)

{
  int iVar1;
  t_program *program;
  string *this_00;
  t_set *set;
  string sStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &sStack_e8;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&sStack_e8);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar1 == '\0') {
          if ((this->namespaced_ == true) &&
             ((t_swift_generator *)ttype->program_ !=
              (t_swift_generator *)(this->super_t_oop_generator).super_t_generator.program_)) {
            get_real_swift_module_abi_cxx11_(&local_c8,(t_swift_generator *)ttype->program_,program)
            ;
            std::operator+(&sStack_e8,&local_c8,".");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&sStack_e8);
            std::__cxx11::string::~string((string *)&local_c8);
          }
          (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_002afba0;
        }
        type_name_abi_cxx11_(&local_a8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false,false);
        std::operator+(&local_c8,"TList<",&local_a8);
        std::operator+(&sStack_e8,&local_c8,">");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        type_name_abi_cxx11_(&local_a8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false,false);
        std::operator+(&local_c8,"TSet<",&local_a8);
        std::operator+(&sStack_e8,&local_c8,">");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)&sStack_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      this_00 = &local_a8;
    }
    else {
      type_name_abi_cxx11_(&local_68,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false,false);
      std::operator+(&local_48,"TMap<",&local_68);
      std::operator+(&local_a8,&local_48,", ");
      type_name_abi_cxx11_
                (&local_88,this,*(t_type **)&ttype[1].annotations_._M_t._M_impl,false,false);
      std::operator+(&local_c8,&local_a8,&local_88);
      std::operator+(&sStack_e8,&local_c8,">");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_48);
      this_00 = &local_68;
    }
  }
  else {
    base_type_name_abi_cxx11_(&sStack_e8,this,(t_base_type *)ttype);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_002afba0:
  if (is_optional) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (is_forced) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::type_name(t_type* ttype, bool is_optional, bool is_forced) {
  string result = "";

  if (ttype->is_base_type()) {
    result += base_type_name((t_base_type*)ttype);
  } else if (ttype->is_map()) {
    t_map *map = (t_map *)ttype;
    result += "TMap<" + type_name(map->get_key_type()) + ", " + type_name(map->get_val_type()) + ">";
  } else if (ttype->is_set()) {
    t_set *set = (t_set *)ttype;
    result += "TSet<" + type_name(set->get_elem_type()) + ">";
  } else if (ttype->is_list()) {
    t_list *list = (t_list *)ttype;
    result += "TList<" + type_name(list->get_elem_type()) + ">";
  }
  else {
    t_program* program = ttype->get_program();
    if (namespaced_ && program != program_) {
      result += get_real_swift_module(program) + ".";
    }
    result += ttype->get_name();
  }

  if (is_optional) {
    result += "?";
  }
  if (is_forced) {
    result += "!";
  }

  return result;
}